

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

void EOPLL_reset(EOPLL *opll)

{
  uint32_t *puVar1;
  int iVar2;
  long lVar3;
  
  if (opll != (EOPLL *)0x0) {
    opll->adr = '\0';
    opll->noise = 1;
    opll->rhythm_mode = '\0';
    opll->slot_key_status = 0;
    opll->eg_counter = 0;
    opll->pm_phase = 0;
    opll->am_phase = 0;
    if (opll->chip_type == '\x01') {
      opll->reg[0xe] = ' ';
      update_rhythm_mode(opll);
    }
    reset_rate_conversion_params(opll);
    puVar1 = &opll->slot[0].eg_out;
    for (lVar3 = 0; lVar3 != 0x12; lVar3 = lVar3 + 1) {
      ((EOPLL_SLOT *)(puVar1 + -0x10))->number = (byte)lVar3;
      *(byte *)((long)puVar1 + -0x3f) = (byte)lVar3 & 1;
      *(uint8_t *)(puVar1 + -6) = '\0';
      *(uint16_t **)(puVar1 + -10) = fullsin_table;
      *(undefined8 *)(puVar1 + -8) = 0;
      (puVar1 + -0xc)[0] = 0;
      (puVar1 + -0xc)[1] = 0;
      *(undefined8 *)(puVar1 + -1) = 0x7f00000000;
      *(undefined4 *)((long)puVar1 + -0x16) = 0;
      *(undefined2 *)((long)puVar1 + -0x12) = 0x300;
      *(undefined8 *)(puVar1 + -4) = 0;
      *(uint8_t *)(puVar1 + -2) = '\0';
      *(EOPLL_PATCH **)(puVar1 + -0xe) = &null_patch;
      puVar1 = puVar1 + 0x12;
    }
    for (iVar2 = 0; iVar2 != 9; iVar2 = iVar2 + 1) {
      set_patch(opll,iVar2,0);
    }
    for (iVar2 = 0; iVar2 != 0x40; iVar2 = iVar2 + 1) {
      EOPLL_writeReg(opll,(uint8_t)iVar2,'\0');
    }
    for (lVar3 = 0; lVar3 != 0xe; lVar3 = lVar3 + 1) {
      opll->ch_out[lVar3] = 0;
    }
  }
  return;
}

Assistant:

void EOPLL_reset(EOPLL *opll) {
  int i;

  if (!opll)
    return;

  opll->adr = 0;

  opll->pm_phase = 0;
  opll->am_phase = 0;

  opll->noise = 0x1;
  //opll->mask = 0;

  opll->rhythm_mode = 0;
  opll->slot_key_status = 0;
  opll->eg_counter = 0;
  if (opll->chip_type == 1)
  {
    opll->reg[0x0e] = 32;
    update_rhythm_mode(opll);
  }

  reset_rate_conversion_params(opll);

  for (i = 0; i < 18; i++)
    reset_slot(&opll->slot[i], i);

  for (i = 0; i < 9; i++) {
    set_patch(opll, i, 0);
  }

  for (i = 0; i < 0x40; i++)
    EOPLL_writeReg(opll, i, 0);

  /*for (i = 0; i < 15; i++) {
    opll->pan[i] = 3;
    Panning_Centre(opll->pan_fine[i]);
  }*/

  for (i = 0; i < 14; i++) {
    opll->ch_out[i] = 0;
  }
}